

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

result * __thiscall
lest::expression_lhs<lest::approx_const&>::operator==
          (result *__return_storage_ptr__,expression_lhs<lest::approx_const&> *this,double *rhs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  lest *this_00;
  size_type sVar5;
  char *pcVar6;
  double *in_R8;
  double dVar7;
  double dVar8;
  double *local_d8;
  double local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  undefined8 uStack_c0;
  string local_b8;
  approx local_98;
  undefined8 uStack_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  bool local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  this_00 = *(lest **)this;
  dVar2 = *rhs;
  dVar3 = *(double *)(this_00 + 0x10);
  dVar7 = ABS(dVar2);
  dVar8 = ABS(dVar3);
  if (dVar7 <= dVar8) {
    dVar8 = dVar7;
  }
  dVar7 = *(double *)(this_00 + 8);
  dVar4 = *(double *)this_00;
  local_d8 = (double *)&local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"==","");
  local_98.epsilon_ = (double)&local_98.magnitude_;
  if (local_d8 == (double *)&local_c8) {
    uStack_80 = uStack_c0;
  }
  else {
    local_98.epsilon_ = (double)local_d8;
  }
  local_98.magnitude_ = (double)CONCAT71(uStack_c7,local_c8);
  local_98.scale_ = local_d0;
  local_d0 = 0.0;
  local_c8 = 0;
  local_d8 = (double *)&local_c8;
  to_string<lest::approx,double>(&local_b8,this_00,&local_98,(string *)rhs,in_R8);
  sVar5 = local_b8._M_string_length;
  paVar1 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p == paVar1) {
    local_68._8_8_ = local_b8.field_2._8_8_;
    local_b8._M_dataplus._M_p = (pointer)&local_68;
  }
  local_68._M_allocated_capacity._1_7_ = local_b8.field_2._M_allocated_capacity._1_7_;
  local_68._M_local_buf[0] = local_b8.field_2._M_local_buf[0];
  local_70 = local_b8._M_string_length;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  pcVar6 = local_b8._M_dataplus._M_p + sVar5;
  local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_b8._M_dataplus._M_p;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  local_58 = ABS(dVar2 - dVar3) < (dVar8 + dVar7) * dVar4;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_78,pcVar6);
  __return_storage_ptr__->passed = local_58;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_50,local_48 + (long)local_50);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
  }
  if ((double *)local_98.epsilon_ != &local_98.magnitude_) {
    operator_delete((void *)local_98.epsilon_,(long)local_98.magnitude_ + 1);
  }
  if (local_d8 != (double *)&local_c8) {
    operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator<=( R const & rhs ) { return result( lhs <= rhs, to_string( lhs, "<=", rhs ) ); }